

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O1

void __thiscall
embree::OBJLoader::OBJLoader
          (OBJLoader *this,FileName *fileName,bool subdivMode,bool combineIntoSingleObject)

{
  atomic<unsigned_long> *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  _Rb_tree_header *p_Var4;
  pointer *ppCVar5;
  byte bVar6;
  MaterialNode *pMVar7;
  ulong uVar8;
  iterator __position;
  pointer pcVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar13;
  iterator iVar14;
  _Alloc_hider _Var15;
  char cVar16;
  char cVar17;
  int iVar18;
  GroupNode *this_00;
  Node *pNVar19;
  size_t sVar20;
  byte *pbVar21;
  Vec3fa *pVVar22;
  long lVar23;
  size_t sVar24;
  iterator iVar25;
  mapped_type *pmVar26;
  size_t sVar27;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar28;
  runtime_error *prVar29;
  undefined7 in_register_00000009;
  ulong uVar30;
  Vec3fa *pVVar31;
  float fVar32;
  byte *pbVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  ulong uVar36;
  ulong uVar37;
  byte *pbVar38;
  uint uVar39;
  bool bVar40;
  float fVar41;
  undefined4 uVar42;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  string next_line;
  string line;
  ifstream cin;
  byte *local_360;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_358;
  iterator iStack_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  OBJLoader *local_338;
  Node *local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  string *local_308;
  size_t *local_300;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined4 local_2d0;
  int local_2cc;
  vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>> *local_2c8;
  vector<embree::Crease,_std::allocator<embree::Crease>_> *local_2c0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_2b8;
  vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  *local_2b0;
  string local_2a8;
  undefined8 local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  ulong local_270;
  FileName *local_268;
  _Base_ptr local_260;
  string local_258;
  long local_238 [65];
  
  local_2d0 = (undefined4)CONCAT71(in_register_00000009,combineIntoSingleObject);
  this_00 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,0);
  (this->group).ptr = this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_268 = &this->path;
  local_338 = this;
  FileName::path(local_268,fileName);
  this->subdivMode = subdivMode;
  local_300 = &(this->v).size_active;
  local_2c8 = (vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>> *)&this->vt;
  local_2c0 = &this->ec;
  local_2b0 = &this->curGroup;
  local_2b8 = &this->curGroupHair;
  local_308 = (string *)&this->curMaterialName;
  local_278 = &(this->curMaterialName).field_2;
  (this->v).size_active = 0;
  (this->v).size_alloced = 0;
  (this->v).items = (Vec3fa *)0x0;
  (this->vn).size_active = 0;
  (this->vn).size_alloced = 0;
  (this->vn).items = (Vec3fa *)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curMaterialName)._M_dataplus._M_p = (pointer)local_278;
  (this->curMaterialName)._M_string_length = 0;
  (this->curMaterialName).field_2._M_local_buf[0] = '\0';
  (this->curMaterial).ptr = (MaterialNode *)0x0;
  local_2f8 = &this->material;
  local_260 = &(this->material)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_260;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_260;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = &(this->textureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  cVar16 = std::__basic_file<char>::is_open();
  if (cVar16 == '\0') {
    prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_358 = (anon_union_8_2_4062524c_for_Vec2<float>_1)&local_348;
    pcVar9 = (fileName->filename)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,pcVar9,pcVar9 + (fileName->filename)._M_string_length);
    std::operator+(&local_2f0,"cannot open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_358.field_0);
    std::runtime_error::runtime_error(prVar29,(string *)&local_2f0);
    __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pNVar19 = (Node *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
  local_258.field_2._M_allocated_capacity._0_4_ = 0x61666564;
  local_258.field_2._M_allocated_capacity._4_3_ = 0x746c75;
  local_258._M_string_length = 7;
  local_258.field_2._M_local_buf[7] = '\0';
  local_330 = pNVar19;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  SceneGraph::Node::Node(pNVar19,&local_258);
  (pNVar19->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_002cbae0;
  *(undefined4 *)&pNVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&pNVar19[1].fileName._M_string_length = 0;
  *(undefined8 *)((long)&pNVar19[1].fileName._M_string_length + 4) = 0x3f8000003f800000;
  *(undefined4 *)((long)&pNVar19[1].fileName.field_2 + 4) = 0x3f800000;
  *(undefined8 *)((long)&pNVar19[1].fileName.field_2 + 8) = 0;
  pNVar19[1].name._M_dataplus._M_p = (pointer)0x0;
  pNVar19[1].name._M_string_length = 0x3f8000003f800000;
  pNVar19[1].name.field_2._M_allocated_capacity = 0x3f8000003f800000;
  *(undefined8 *)((long)&pNVar19[1].name.field_2 + 8) = 0;
  pNVar19[1].indegree = 0;
  pNVar19[1].closed = false;
  pNVar19[1].hasLightOrCamera = false;
  *(undefined2 *)&pNVar19[1].field_0x5a = 0x3f80;
  pNVar19[1].id = 0x3f800000;
  pNVar19[1].geometry = (void *)0x3f8000003f800000;
  memset(pNVar19 + 2,0,0xa8);
  LOCK();
  paVar1 = &(pNVar19->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  pNVar19 = local_330;
  std::__cxx11::string::_M_replace
            ((ulong)local_308,0,(char *)(this->curMaterialName)._M_string_length,0x25ddf6);
  (*(pNVar19->super_RefCount)._vptr_RefCount[2])(pNVar19);
  pMVar7 = (this->curMaterial).ptr;
  if (pMVar7 != (MaterialNode *)0x0) {
    (*(pMVar7->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  (this->curMaterial).ptr = (MaterialNode *)pNVar19;
  do {
    iVar18 = std::istream::peek();
    if (iVar18 == -1) {
      flushTriGroup(this);
      flushHairGroup(this);
      std::ifstream::close();
      (*(pNVar19->super_RefCount)._vptr_RefCount[3])(pNVar19);
      std::ifstream::~ifstream(local_238);
      return;
    }
    local_2f0._M_string_length = 0;
    local_2f0.field_2._M_local_buf[0] = '\0';
    cVar16 = (char)(istream *)local_238;
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    cVar17 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar16);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_2f0,cVar17);
    do {
      if ((local_2f0._M_string_length == 0) ||
         (local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 1] != '\\')) break;
      local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 1] = ' ';
      local_358 = (anon_union_8_2_4062524c_for_Vec2<float>_1)&local_348;
      iStack_350._M_current._0_4_ = 0;
      iStack_350._M_current._4_4_ = 0;
      local_348._M_allocated_capacity = local_348._M_allocated_capacity & 0xffffffffffffff00;
      cVar17 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar16);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_358.field_0,cVar17);
      lVar23 = CONCAT44(iStack_350._M_current._4_4_,(uint)iStack_350._M_current);
      if (lVar23 != 0) {
        std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_358);
      }
      if (local_358 != (anon_union_8_2_4062524c_for_Vec2<float>_1)&local_348) {
        operator_delete((void *)local_358);
      }
    } while (lVar23 != 0);
    _Var15._M_p = local_2f0._M_dataplus._M_p;
    sVar20 = strspn(local_2f0._M_dataplus._M_p," \t");
    pbVar38 = (byte *)(_Var15._M_p + sVar20);
    if (_Var15._M_p[sVar20] != '\0') {
      pbVar33 = (byte *)(_Var15._M_p + (sVar20 - 1));
      do {
        pbVar21 = pbVar33;
        pbVar33 = pbVar21 + 1;
      } while (pbVar21[1] != 0);
      for (; (((ulong)*pbVar21 < 0x21 && ((0x100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0)) &&
             (pbVar38 <= pbVar21)); pbVar21 = pbVar21 + -1) {
        *pbVar21 = 0;
      }
    }
    bVar6 = *pbVar38;
    local_360 = pbVar38;
    aVar13 = local_358;
    if (bVar6 != 0) {
      if (bVar6 == 0x66) {
        if ((pbVar38[1] != 0x20) && (pbVar38[1] != 9)) goto LAB_0013e597;
        pbVar38 = pbVar38 + 1;
        local_360 = pbVar38;
        sVar20 = strspn((char *)pbVar38," \t");
        if (sVar20 == 0) {
          prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar29,"separator expected");
          goto LAB_0013efca;
        }
        local_360 = pbVar38 + sVar20;
        local_358.field_0.x = 0.0;
        local_358.field_0.y = 0.0;
        iStack_350._M_current = (Vertex *)0x0;
        local_348._M_allocated_capacity = 0;
        bVar6 = pbVar38[sVar20];
        while (bVar6 != 0) {
          local_2a8._0_12_ = getUInt3(this,(char **)&local_360);
          if (iStack_350._M_current == (Vertex *)local_348._M_allocated_capacity) {
            std::vector<embree::Vertex,std::allocator<embree::Vertex>>::
            _M_realloc_insert<embree::Vertex_const&>
                      ((vector<embree::Vertex,std::allocator<embree::Vertex>> *)&local_358.field_0,
                       iStack_350,(Vertex *)&local_2a8);
          }
          else {
            (iStack_350._M_current)->vn = (uint)local_2a8._M_string_length;
            *(pointer *)iStack_350._M_current = local_2a8._M_dataplus._M_p;
            iStack_350._M_current = iStack_350._M_current + 1;
          }
          pbVar38 = local_360;
          sVar20 = strspn((char *)local_360," \t");
          local_360 = pbVar38 + sVar20;
          bVar6 = pbVar38[sVar20];
        }
        std::
        vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
        ::push_back(local_2b0,(value_type *)&local_358.field_0);
        aVar13 = local_358;
        if (local_358 == (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0) goto LAB_0013ed1f;
LAB_0013ed1a:
        operator_delete((void *)local_358);
        local_358 = aVar13;
        aVar13 = local_358;
      }
      else {
        if (bVar6 == 0x76) {
          if ((pbVar38[1] == 0x20) || (pbVar38[1] == 9)) {
            local_360 = pbVar38 + 2;
            getVec3f((embree *)&local_358.field_0,(char **)&local_360);
            auVar11 = local_318;
            sVar24 = (this->v).size_active;
            uVar8 = (this->v).size_alloced;
            uVar30 = sVar24 + 1;
            uVar36 = uVar8;
            if ((uVar8 < uVar30) && (uVar37 = uVar8, uVar36 = uVar30, uVar8 != 0)) {
              do {
                uVar36 = uVar37 * 2 + (ulong)(uVar37 * 2 == 0);
                uVar37 = uVar36;
              } while (uVar36 < uVar30);
            }
            local_318._4_4_ = (uint)iStack_350._M_current;
            local_318._0_4_ = local_358.field_0.y;
            fVar32 = 0.0;
            uVar42 = (uint)iStack_350._M_current;
            aVar28 = local_358;
            if (uVar8 != uVar36) {
              local_318._8_8_ = 0;
              local_328 = ZEXT416((uint)local_358.field_0.x);
              pVVar31 = (this->v).items;
              pVVar22 = (Vec3fa *)alignedMalloc(uVar36 << 4,0x10);
              (this->v).items = pVVar22;
              if ((this->v).size_active != 0) {
                lVar23 = 0;
                uVar30 = 0;
                do {
                  puVar3 = (undefined8 *)((long)&pVVar31->field_0 + lVar23);
                  uVar12 = puVar3[1];
                  puVar2 = (undefined8 *)((long)&((this->v).items)->field_0 + lVar23);
                  *puVar2 = *puVar3;
                  puVar2[1] = uVar12;
                  uVar30 = uVar30 + 1;
                  lVar23 = lVar23 + 0x10;
                } while (uVar30 < (this->v).size_active);
              }
              alignedFree(pVVar31);
              (this->v).size_active = sVar24;
              (this->v).size_alloced = uVar36;
              aVar28.field_0.y = (float)local_318._0_4_;
              aVar28.field_0.x = (float)local_328._0_4_;
              fVar32 = (float)local_328._12_4_;
              uVar42 = local_318._4_4_;
              auVar11 = local_318;
            }
            local_318 = auVar11;
            sVar24 = (this->v).size_active;
            pVVar31 = (this->v).items;
            (this->v).size_active = sVar24 + 1;
            aVar13 = local_358;
LAB_0013e3ad:
            pVVar31 = pVVar31 + sVar24;
            *(anon_union_8_2_4062524c_for_Vec2<float>_1 *)&pVVar31->field_0 = aVar28;
            *(undefined4 *)((long)&pVVar31->field_0 + 8) = uVar42;
            (pVVar31->field_0).m128[3] = fVar32;
            pNVar19 = local_330;
            goto LAB_0013ed1f;
          }
          if (pbVar38[1] == 0x74) {
            if ((pbVar38[2] == 0x20) || (pbVar38[2] == 9)) {
              local_360 = pbVar38 + 3;
              sVar20 = strspn((char *)local_360," \t");
              pbVar38 = pbVar38 + sVar20 + 3;
              local_360 = pbVar38;
              dVar10 = atof((char *)pbVar38);
              local_328._8_4_ = extraout_XMM0_Dc;
              local_328._0_8_ = dVar10;
              local_328._12_4_ = extraout_XMM0_Dd;
              sVar20 = strcspn((char *)pbVar38," \t\r");
              pbVar38 = pbVar38 + sVar20;
              local_360 = pbVar38;
              sVar20 = strspn((char *)pbVar38," \t");
              pbVar38 = pbVar38 + sVar20;
              local_360 = pbVar38;
              dVar10 = atof((char *)pbVar38);
              local_318._8_4_ = extraout_XMM0_Dc_00;
              local_318._0_8_ = dVar10;
              local_318._12_4_ = extraout_XMM0_Dd_00;
              sVar20 = strcspn((char *)pbVar38," \t\r");
              local_360 = pbVar38 + sVar20;
              local_358.field_0.x = (float)(double)local_328._0_8_;
              local_358.field_0.y = (float)(double)local_318._0_8_;
              std::vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>>::
              emplace_back<embree::Vec2<float>>(local_2c8,(Vec2<float> *)&local_358.field_0);
              aVar13.field_0.y = local_358.field_0.y;
              aVar13.field_0.x = local_358.field_0.x;
              goto LAB_0013ed1f;
            }
          }
          else if ((pbVar38[1] == 0x6e) && ((pbVar38[2] == 0x20 || (pbVar38[2] == 9)))) {
            local_360 = pbVar38 + 3;
            getVec3f((embree *)&local_358.field_0,(char **)&local_360);
            auVar11 = local_318;
            sVar24 = (this->vn).size_active;
            uVar8 = (this->vn).size_alloced;
            uVar30 = sVar24 + 1;
            uVar36 = uVar8;
            if ((uVar8 < uVar30) && (uVar37 = uVar8, uVar36 = uVar30, uVar8 != 0)) {
              do {
                uVar36 = uVar37 * 2 + (ulong)(uVar37 * 2 == 0);
                uVar37 = uVar36;
              } while (uVar36 < uVar30);
            }
            local_318._4_4_ = (uint)iStack_350._M_current;
            local_318._0_4_ = local_358.field_0.y;
            fVar32 = 0.0;
            uVar42 = (uint)iStack_350._M_current;
            aVar28 = local_358;
            if (uVar8 != uVar36) {
              local_318._8_8_ = 0;
              local_328 = ZEXT416((uint)local_358.field_0.x);
              pVVar31 = (this->vn).items;
              pVVar22 = (Vec3fa *)alignedMalloc(uVar36 << 4,0x10);
              (this->vn).items = pVVar22;
              if ((this->vn).size_active != 0) {
                lVar23 = 0;
                uVar30 = 0;
                do {
                  puVar3 = (undefined8 *)((long)&pVVar31->field_0 + lVar23);
                  uVar12 = puVar3[1];
                  puVar2 = (undefined8 *)((long)&((this->vn).items)->field_0 + lVar23);
                  *puVar2 = *puVar3;
                  puVar2[1] = uVar12;
                  uVar30 = uVar30 + 1;
                  lVar23 = lVar23 + 0x10;
                } while (uVar30 < (this->vn).size_active);
              }
              alignedFree(pVVar31);
              (this->vn).size_active = sVar24;
              (this->vn).size_alloced = uVar36;
              aVar28.field_0.y = (float)local_318._0_4_;
              aVar28.field_0.x = (float)local_328._0_4_;
              fVar32 = (float)local_328._12_4_;
              uVar42 = local_318._4_4_;
              auVar11 = local_318;
            }
            local_318 = auVar11;
            sVar24 = (this->vn).size_active;
            pVVar31 = (this->vn).items;
            (this->vn).size_active = sVar24 + 1;
            aVar13 = local_358;
            goto LAB_0013e3ad;
          }
        }
LAB_0013e597:
        iVar18 = strncmp((char *)pbVar38,"hair",4);
        if ((iVar18 == 0) && ((pbVar38[4] == 0x20 || (pbVar38[4] == 9)))) {
          pbVar38 = pbVar38 + 4;
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          if (sVar20 == 0) {
            prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar29,"separator expected");
            goto LAB_0013efca;
          }
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          iVar18 = strncmp((char *)pbVar38,"plane",5);
          if ((iVar18 == 0) && ((pbVar38[5] == 0x20 || (pbVar38[5] == 9)))) {
            pbVar38 = pbVar38 + 5;
            local_360 = pbVar38;
            sVar20 = strspn((char *)pbVar38," \t");
            if (sVar20 == 0) {
              prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar29,"separator expected");
LAB_0013f0b4:
              __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            iVar18 = strncmp((char *)pbVar38,"cylinder",8);
            aVar13 = local_358;
            if ((iVar18 != 0) || ((pbVar38[8] != 0x20 && (pbVar38[8] != 9)))) goto LAB_0013ed1f;
            pbVar38 = pbVar38 + 8;
            local_360 = pbVar38;
            sVar20 = strspn((char *)pbVar38," \t");
            if (sVar20 == 0) {
              prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar29,"separator expected");
              goto LAB_0013f0b4;
            }
          }
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          uVar39 = atoi((char *)pbVar38);
          sVar20 = strcspn((char *)pbVar38," \t\r");
          pbVar38 = pbVar38 + sVar20;
          iStack_350._M_current = (Vertex *)0x0;
          local_348._M_allocated_capacity = 0;
          local_348._8_8_ = (void *)0x0;
          local_270 = (ulong)uVar39;
          if (uVar39 != 0x55555555) {
            local_2cc = uVar39 * 3;
            iVar18 = 0;
            local_360 = pbVar38;
            iStack_350._M_current = (Vertex *)0;
            do {
              sVar20 = strspn((char *)pbVar38," \t");
              pbVar38 = pbVar38 + sVar20;
              dVar10 = atof((char *)pbVar38);
              local_328._4_4_ = (int)((ulong)dVar10 >> 0x20);
              local_328._0_4_ = (float)dVar10;
              local_328._8_4_ = extraout_XMM0_Dc_01;
              local_328._12_4_ = extraout_XMM0_Dd_01;
              sVar20 = strcspn((char *)pbVar38," \t\r");
              pbVar33 = pbVar38 + sVar20;
              sVar20 = strspn((char *)pbVar33," \t");
              pbVar38 = pbVar33 + sVar20;
              if (pbVar33[sVar20] == 0) {
                local_318._0_8_ = local_328._0_8_;
                local_288 = local_318._0_8_;
                local_318 = local_328;
                uStack_280 = local_328._8_4_;
                uStack_27c = local_328._12_4_;
                iVar14._M_current = iStack_350._M_current;
              }
              else {
                sVar20 = strspn((char *)pbVar38," \t");
                pbVar38 = pbVar38 + sVar20;
                dVar10 = atof((char *)pbVar38);
                local_318._4_4_ = (int)((ulong)dVar10 >> 0x20);
                local_318._0_4_ = (float)dVar10;
                local_318._8_4_ = extraout_XMM0_Dc_02;
                local_318._12_4_ = extraout_XMM0_Dd_02;
                sVar20 = strcspn((char *)pbVar38," \t\r");
                sVar27 = strspn((char *)(pbVar38 + sVar20)," \t");
                pbVar38 = pbVar38 + sVar20 + sVar27;
                dVar10 = atof((char *)pbVar38);
                local_288 = CONCAT44((int)((ulong)dVar10 >> 0x20),(float)dVar10);
                uStack_280 = extraout_XMM0_Dc_03;
                uStack_27c = extraout_XMM0_Dd_03;
                sVar20 = strcspn((char *)pbVar38," \t\r");
                pbVar38 = pbVar38 + sVar20;
                iVar14._M_current = iStack_350._M_current;
              }
              uVar12 = local_348._8_8_;
              uVar30 = (long)iVar14._M_current + 1;
              uVar35 = local_348._M_allocated_capacity;
              if ((local_348._M_allocated_capacity < uVar30) &&
                 (uVar34 = local_348._M_allocated_capacity, uVar35 = uVar30,
                 local_348._M_allocated_capacity != 0)) {
                do {
                  uVar35 = uVar34 * 2 + (ulong)(uVar34 * 2 == 0);
                  uVar34 = uVar35;
                } while ((ulong)uVar35 < uVar30);
              }
              uVar42 = local_328._0_4_;
              if (local_348._M_allocated_capacity != uVar35) {
                iStack_350._M_current = iVar14._M_current;
                local_348._8_8_ = alignedMalloc(uVar35 << 4,0x10);
                if (iStack_350._M_current != (Vertex *)0x0) {
                  lVar23 = 0;
                  uVar30 = 0;
                  do {
                    puVar3 = (undefined8 *)(uVar12 + lVar23);
                    uVar34 = puVar3[1];
                    *(undefined8 *)(local_348._8_8_ + lVar23) = *puVar3;
                    ((undefined8 *)(local_348._8_8_ + lVar23))[1] = uVar34;
                    uVar30 = uVar30 + 1;
                    lVar23 = lVar23 + 0x10;
                  } while (uVar30 < iStack_350._M_current);
                }
                alignedFree((void *)uVar12);
                uVar42 = local_328._0_4_;
                local_348._M_allocated_capacity = uVar35;
              }
              iStack_350._M_current = iVar14._M_current + 1;
              auVar11._4_4_ = local_318._0_4_;
              auVar11._0_4_ = uVar42;
              auVar11._8_4_ = (undefined4)local_288;
              auVar11._12_4_ = 0;
              *(undefined1 (*) [16])(local_348._8_8_ + (long)iVar14._M_current * 0x10) = auVar11;
              bVar40 = iVar18 != local_2cc;
              iVar18 = iVar18 + 1;
            } while (bVar40);
          }
          uVar39 = (int)local_270 + 1;
          if (uVar39 != 0) {
            local_318._0_8_ = (local_270 & 0xffffffff) * 3;
            local_288 = (ulong)uVar39 * 3;
            uVar30 = 0;
            local_360 = pbVar38;
            do {
              sVar20 = strspn((char *)pbVar38," \t");
              pbVar38 = pbVar38 + sVar20;
              dVar10 = atof((char *)pbVar38);
              local_328._0_4_ = (float)dVar10;
              sVar20 = strcspn((char *)pbVar38," \t\r");
              pbVar38 = pbVar38 + sVar20;
              sVar20 = strspn((char *)pbVar38," \t");
              sVar27 = strcspn((char *)(pbVar38 + sVar20)," \t\r");
              if (uVar30 != 0) {
                *(undefined4 *)(local_348._8_8_ + 0xc + (ulong)((int)uVar30 - 1) * 0x10) =
                     local_328._0_4_;
              }
              *(undefined4 *)(local_348._8_8_ + 0xc + (uVar30 & 0xffffffff) * 0x10) =
                   local_328._0_4_;
              if (local_318._0_8_ != uVar30) {
                *(undefined4 *)(local_348._8_8_ + 0xc + (ulong)((int)uVar30 + 1) * 0x10) =
                     local_328._0_4_;
              }
              pbVar38 = pbVar38 + sVar20 + sVar27;
              uVar30 = uVar30 + 3;
            } while (local_288 != uVar30);
          }
          local_360 = pbVar38;
          std::
          vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ::push_back(local_2b8,(value_type *)&local_358.field_0);
          alignedFree((void *)local_348._8_8_);
          iStack_350._M_current = (Vertex *)0x0;
          local_348._M_allocated_capacity = 0;
          local_348._8_8_ = 0;
          pNVar19 = local_330;
          this = local_338;
        }
        pbVar38 = local_360;
        if (((*local_360 == 0x65) && (local_360[1] == 99)) &&
           ((local_360[2] == 0x20 || (local_360[2] == 9)))) {
          pbVar38 = local_360 + 2;
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          if (sVar20 == 0) {
            prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar29,"separator expected");
LAB_0013efca:
            __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          dVar10 = atof((char *)pbVar38);
          local_328._0_8_ = dVar10;
          sVar20 = strcspn((char *)pbVar38," \t\r");
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          iVar18 = atoi((char *)pbVar38);
          sVar20 = strcspn((char *)pbVar38," \t\r");
          pbVar38 = pbVar38 + sVar20;
          if (iVar18 < 1) {
            if (iVar18 == 0) {
              fVar32 = 0.0;
            }
            else {
              fVar32 = (float)(iVar18 + (int)*local_300);
            }
          }
          else {
            fVar32 = (float)(iVar18 + -1);
          }
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          pbVar38 = pbVar38 + sVar20;
          local_360 = pbVar38;
          iVar18 = atoi((char *)pbVar38);
          sVar20 = strcspn((char *)pbVar38," \t\r");
          this = local_338;
          pbVar38 = pbVar38 + sVar20;
          if (iVar18 < 1) {
            if (iVar18 == 0) {
              uVar39 = 0;
            }
            else {
              uVar39 = iVar18 + (int)*local_300;
            }
          }
          else {
            uVar39 = iVar18 - 1;
          }
          fVar41 = (float)(double)local_328._0_8_;
          local_328._0_4_ = fVar41;
          local_360 = pbVar38;
          sVar20 = strspn((char *)pbVar38," \t");
          iStack_350._M_current = (Vertex *)CONCAT44(iStack_350._M_current._4_4_,uVar39);
          local_360 = pbVar38 + sVar20;
          aVar13.field_0.y = fVar32;
          aVar13.field_0.x = (float)local_328._0_4_;
          local_358.field_0.x = (float)local_328._0_4_;
          __position._M_current =
               (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            local_358.field_0.y = fVar32;
            iStack_350._M_current._0_4_ = uVar39;
            std::vector<embree::Crease,_std::allocator<embree::Crease>_>::
            _M_realloc_insert<embree::Crease>(local_2c0,__position,(Crease *)&local_358.field_0);
            aVar13.field_0.y = local_358.field_0.y;
            aVar13.field_0.x = local_358.field_0.x;
            pNVar19 = local_330;
          }
          else {
            (__position._M_current)->b = uVar39;
            (__position._M_current)->w = (float)local_328._0_4_;
            (__position._M_current)->a = (uint)fVar32;
            ppCVar5 = &(this->ec).
                       super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppCVar5 = *ppCVar5 + 1;
            pNVar19 = local_330;
          }
        }
        else {
          iVar18 = strncmp((char *)local_360,"usemtl",6);
          if ((iVar18 == 0) && ((pbVar38[6] == 0x20 || (pbVar38[6] == 9)))) {
            if ((char)local_2d0 == '\0') {
              flushTriGroup(this);
              flushHairGroup(this);
            }
            pbVar38 = pbVar38 + 6;
            local_360 = pbVar38;
            sVar20 = strspn((char *)pbVar38," \t");
            if (sVar20 == 0) {
              prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar29,"separator expected");
              __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pbVar38 = pbVar38 + sVar20;
            local_358 = (anon_union_8_2_4062524c_for_Vec2<float>_1)&local_348;
            local_360 = pbVar38;
            sVar20 = strlen((char *)pbVar38);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_358,pbVar38,pbVar38 + sVar20);
            iVar25 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                     ::find(&local_2f8->_M_t,(key_type *)&local_358.field_0);
            if (iVar25._M_node == local_260) {
              (*(pNVar19->super_RefCount)._vptr_RefCount[2])(pNVar19);
              pMVar7 = (this->curMaterial).ptr;
              if (pMVar7 != (MaterialNode *)0x0) {
                (*(pMVar7->super_Node).super_RefCount._vptr_RefCount[3])();
              }
              (this->curMaterial).ptr = (MaterialNode *)pNVar19;
              std::__cxx11::string::_M_replace
                        ((ulong)local_308,0,(char *)(this->curMaterialName)._M_string_length,
                         0x25ddf6);
            }
            else {
              pmVar26 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                        ::operator[](local_2f8,(key_type *)&local_358.field_0);
              if (pmVar26->ptr != (MaterialNode *)0x0) {
                (*(pmVar26->ptr->super_Node).super_RefCount._vptr_RefCount[2])();
              }
              pMVar7 = (this->curMaterial).ptr;
              if (pMVar7 != (MaterialNode *)0x0) {
                (*(pMVar7->super_Node).super_RefCount._vptr_RefCount[3])();
              }
              (this->curMaterial).ptr = pmVar26->ptr;
              std::__cxx11::string::_M_assign(local_308);
            }
            aVar28 = (anon_union_8_2_4062524c_for_Vec2<float>_1)&local_348;
            aVar13 = local_358;
          }
          else {
            iVar18 = strncmp((char *)pbVar38,"mtllib",6);
            aVar13 = local_358;
            if ((iVar18 != 0) || ((pbVar38[6] != 0x20 && (pbVar38[6] != 9)))) goto LAB_0013ed1f;
            pbVar38 = pbVar38 + 6;
            local_360 = pbVar38;
            sVar20 = strspn((char *)pbVar38," \t");
            if (sVar20 == 0) {
              prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar29,"separator expected");
              __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pbVar38 = pbVar38 + sVar20;
            local_2a8._M_dataplus._M_p = (pointer)((long)&local_2a8 + 0x10);
            local_360 = pbVar38;
            sVar20 = strlen((char *)pbVar38);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2a8,pbVar38,pbVar38 + sVar20);
            FileName::operator+((FileName *)&local_358.field_0,local_268,&local_2a8);
            loadMTL(this,(FileName *)&local_358.field_0);
            aVar13 = local_358;
            if (local_358 != (anon_union_8_2_4062524c_for_Vec2<float>_1)&local_348) {
              operator_delete((void *)local_358);
              aVar13 = local_358;
            }
            aVar28 = (anon_union_8_2_4062524c_for_Vec2<float>_1)((long)&local_2a8 + 0x10);
            local_358 = (anon_union_8_2_4062524c_for_Vec2<float>_1)local_2a8._M_dataplus._M_p;
          }
          if (local_358 != aVar28) goto LAB_0013ed1a;
        }
      }
    }
LAB_0013ed1f:
    local_358 = aVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

OBJLoader::OBJLoader(const FileName &fileName, const bool subdivMode, const bool combineIntoSingleObject) 
    : group(new SceneGraph::GroupNode), path(fileName.path()), subdivMode(subdivMode)
  {
    /* open file */
    std::ifstream cin;
    cin.open(fileName.c_str());
    if (!cin.is_open()) {
      THROW_RUNTIME_ERROR("cannot open " + fileName.str());
      return;
    }

    /* generate default material */
    Ref<SceneGraph::MaterialNode> defaultMaterial = new OBJMaterial("default");
    curMaterialName = "default";
    curMaterial = defaultMaterial;

    while (cin.peek() != -1)
    {
      /* load next multiline */
      std::string line; std::getline(cin,line);
      while (!line.empty() && line[line.size()-1] == '\\') {
	line[line.size()-1] = ' ';
	std::string next_line; std::getline(cin,next_line);
	if (next_line.empty()) break;
	line += next_line;
      }
      const char* token = trimEnd(line.c_str() + strspn(line.c_str(), " \t"));
      if (token[0] == 0) continue;

      /*! parse position */
      if (token[0] == 'v' && isSep(token[1])) { 
        v.push_back(getVec3f(token += 2)); continue;
      }

      /* parse normal */
      if (token[0] == 'v' && token[1] == 'n' && isSep(token[2])) { 
        vn.push_back(getVec3f(token += 3)); 
        continue; 
      }

      /* parse texcoord */
      if (token[0] == 'v' && token[1] == 't' && isSep(token[2])) { vt.push_back(getVec2f(token += 3)); continue; }

      /*! parse face */
      if (token[0] == 'f' && isSep(token[1]))
      {
        parseSep(token += 1);

        std::vector<Vertex> face;
        while (token[0]) {
	  Vertex vtx = getUInt3(token);
          face.push_back(vtx);
          parseSepOpt(token);
        }
        curGroup.push_back(face);
        continue;
      }

      /*! parse corona hair */
      if (!strncmp(token,"hair",4) && isSep(token[4]))
      {
        parseSep(token += 4);
        bool plane = !strncmp(token,"plane",5) && isSep(token[5]);
        if (plane) {
          parseSep(token += 5);
        }
        else if (!strncmp(token,"cylinder",8) && isSep(token[8])) {
          parseSep(token += 8);
        }
        else continue;

        unsigned int N = getInt(token);
        avector<Vec3ff> hair;
        for (unsigned int i=0; i<3*N+1; i++) {
          hair.push_back((Vec3ff)getVec3fa(token));
        }
        
        for (unsigned int i=0; i<N+1; i++)
        {
          float r = getFloat(token);
          MAYBE_UNUSED float t = (float)getInt(token);
          if (i != 0) hair[3*i-1].w = r;
          hair[3*i+0].w = r;
          if (i != N) hair[3*i+1].w = r;
        }
        curGroupHair.push_back(hair);
      }
      
      /*! parse edge crease */
      if (token[0] == 'e' && token[1] == 'c' && isSep(token[2]))
      {
	parseSep(token += 2);
	float w = getFloat(token);
	parseSepOpt(token);
	unsigned int a = fix_v(getInt(token));
	parseSepOpt(token);
	unsigned int b = fix_v(getInt(token));
	parseSepOpt(token);
	ec.push_back(Crease(w, a, b));
	continue;
      }

      /*! use material */
      if (!strncmp(token, "usemtl", 6) && isSep(token[6]))
      {
        if (!combineIntoSingleObject) flushFaceGroup();
        std::string name(parseSep(token += 6));
        if (material.find(name) == material.end()) {
          curMaterial = defaultMaterial;
          curMaterialName = "default";
        }
        else {
          curMaterial = material[name];
          curMaterialName = name;
        }
        continue;
      }

      /* load material library */
      if (!strncmp(token, "mtllib", 6) && isSep(token[6])) {
        loadMTL(path + std::string(parseSep(token += 6)));
        continue;
      }

      // ignore unknown stuff
    }
    flushFaceGroup();

    cin.close();
  }